

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_expression.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundParameterExpression::Deserialize
          (BoundParameterExpression *this,Deserializer *deserializer)

{
  int iVar1;
  BoundParameterExpression *this_00;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>
  *global_parameter_set;
  LogicalType return_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> identifier;
  shared_ptr<duckdb::BoundParameterData,_true> parameter_data;
  LogicalType local_c8;
  undefined4 local_af;
  undefined2 local_ab;
  undefined1 local_a9;
  reference_wrapper<duckdb::ClientContext> *local_a8;
  _Elt_pointer local_a0;
  reference_wrapper<duckdb::ClientContext> local_98;
  undefined1 uStack_90;
  undefined4 uStack_8f;
  undefined2 uStack_8b;
  undefined1 uStack_89;
  undefined1 local_88 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  shared_ptr<duckdb::BoundParameterData,_true> local_78;
  undefined1 local_68 [17];
  undefined7 uStack_57;
  undefined8 uStack_50;
  LogicalType local_48;
  
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"identifier");
  if ((char)iVar1 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_c8.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_ =
         0;
    local_a8 = &local_98;
    local_98._M_data._0_1_ = 0;
    local_98._M_data._1_7_ = (undefined7)stack0xffffffffffffff49;
    uStack_90 = (undefined1)((ulong)stack0xffffffffffffff49 >> 0x38);
    uStack_8f = local_af;
    uStack_8b = local_ab;
    uStack_89 = local_a9;
    local_a0 = (_Elt_pointer)0x0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_a8,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xc9,"return_type");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  LogicalType::Deserialize(&local_c8,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  Deserializer::ReadPropertyWithDefault<duckdb::shared_ptr<duckdb::BoundParameterData,true>>
            ((Deserializer *)local_88,(field_id_t)deserializer,(char *)0xca);
  this_00 = (BoundParameterExpression *)operator_new(0x88);
  global_parameter_set =
       Deserializer::
       Get<std::unordered_map<std::__cxx11::string,duckdb::shared_ptr<duckdb::BoundParameterData,true>,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::shared_ptr<duckdb::BoundParameterData,true>>>>&>
                 (deserializer);
  if (local_a8 == &local_98) {
    uStack_50 = CONCAT17(uStack_89,CONCAT25(uStack_8b,CONCAT41(uStack_8f,uStack_90)));
    local_68._0_8_ = (reference_wrapper<duckdb::ClientContext> *)(local_68 + 0x10);
  }
  else {
    local_68._0_8_ = local_a8;
  }
  uStack_57 = local_98._M_data._1_7_;
  local_68[0x10] = local_98._M_data._0_1_;
  local_68._8_8_ = local_a0;
  local_a0 = (_Elt_pointer)0x0;
  local_98._M_data._0_1_ = 0;
  local_a8 = &local_98;
  LogicalType::LogicalType(&local_48,&local_c8);
  local_78.internal.super___shared_ptr<duckdb::BoundParameterData,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)local_88;
  local_78.internal.super___shared_ptr<duckdb::BoundParameterData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Stack_80;
  local_88 = (undefined1  [8])0x0;
  p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  BoundParameterExpression(this_00,global_parameter_set,(string *)local_68,&local_48,&local_78);
  if (local_78.internal.super___shared_ptr<duckdb::BoundParameterData,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.internal.
               super___shared_ptr<duckdb::BoundParameterData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_48);
  if ((reference_wrapper<duckdb::ClientContext> *)local_68._0_8_ !=
      (reference_wrapper<duckdb::ClientContext> *)(local_68 + 0x10)) {
    operator_delete((void *)local_68._0_8_);
  }
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression = (_func_int **)this_00;
  if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
  }
  LogicalType::~LogicalType(&local_c8);
  if (local_a8 != &local_98) {
    operator_delete(local_a8);
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundParameterExpression::Deserialize(Deserializer &deserializer) {
	auto identifier = deserializer.ReadPropertyWithDefault<string>(200, "identifier");
	auto return_type = deserializer.ReadProperty<LogicalType>(201, "return_type");
	auto parameter_data = deserializer.ReadPropertyWithDefault<shared_ptr<BoundParameterData>>(202, "parameter_data");
	auto result = duckdb::unique_ptr<BoundParameterExpression>(new BoundParameterExpression(deserializer.Get<bound_parameter_map_t &>(), std::move(identifier), std::move(return_type), std::move(parameter_data)));
	return std::move(result);
}